

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDsdInternal(Abc_Ntk_t *pNtk,int fVerbose,int fPrint,int fShort)

{
  DdNode **pbFuncs;
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  void *pvVar2;
  DdManager *dd_00;
  Dsd_Manager_t *pDsdMan;
  char **pInputNames;
  char **pOutputNames;
  int local_64;
  int i;
  Abc_Obj_t *pObj;
  DdManager *dd;
  Abc_Ntk_t *pNtkNew;
  Dsd_Manager_t *pManDsd;
  Vec_Ptr_t *vFuncsGlob;
  char **ppNamesCo;
  char **ppNamesCi;
  int fShort_local;
  int fPrint_local;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCoNum(pNtk);
  p = Vec_PtrAlloc(iVar1);
  for (local_64 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_64 < iVar1; local_64 = local_64 + 1) {
    pObj_00 = Abc_NtkCo(pNtk,local_64);
    pvVar2 = Abc_ObjGlobalBdd(pObj_00);
    iVar1 = Abc_ObjFaninC0(pObj_00);
    Vec_PtrPush(p,(void *)((ulong)pvVar2 ^ (long)iVar1));
  }
  dd_00 = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
  iVar1 = Abc_NtkCiNum(pNtk);
  pDsdMan = Dsd_ManagerStart(dd_00,iVar1,fVerbose);
  if (pDsdMan == (Dsd_Manager_t *)0x0) {
    Vec_PtrFree(p);
    Cudd_Quit(dd_00);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pbFuncs = (DdNode **)p->pArray;
    iVar1 = Abc_NtkCoNum(pNtk);
    Dsd_Decompose(pDsdMan,pbFuncs,iVar1);
    Vec_PtrFree(p);
    Abc_NtkFreeGlobalBdds(pNtk,0);
    pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
    Cudd_bddIthVar((DdManager *)pNtk_local->pManFunc,dd_00->size + -1);
    Abc_NtkDsdConstruct(pDsdMan,pNtk,pNtk_local);
    Abc_NtkFinalize(pNtk,pNtk_local);
    Abc_NtkLogicMakeSimpleCos(pNtk_local,0);
    if (fPrint != 0) {
      pInputNames = Abc_NtkCollectCioNames(pNtk,0);
      pOutputNames = Abc_NtkCollectCioNames(pNtk,1);
      if (fVerbose == 0) {
        Dsd_TreePrint2(_stdout,pDsdMan,pInputNames,pOutputNames,-1);
      }
      else {
        Dsd_TreePrint(_stdout,pDsdMan,pInputNames,pOutputNames,fShort,-1);
      }
      if (pInputNames != (char **)0x0) {
        free(pInputNames);
      }
      if (pOutputNames != (char **)0x0) {
        free(pOutputNames);
      }
    }
    Dsd_ManagerStop(pDsdMan);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDsdInternal( Abc_Ntk_t * pNtk, int fVerbose, int fPrint, int fShort )
{
    char ** ppNamesCi, ** ppNamesCo;
    Vec_Ptr_t * vFuncsGlob;
    Dsd_Manager_t * pManDsd;
    Abc_Ntk_t * pNtkNew;
    DdManager * dd;
    Abc_Obj_t * pObj;
    int i;

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Cudd_NotCond(Abc_ObjGlobalBdd(pObj), Abc_ObjFaninC0(pObj)) );

    // perform the decomposition
    dd = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
    pManDsd = Dsd_ManagerStart( dd, Abc_NtkCiNum(pNtk), fVerbose );
    if ( pManDsd == NULL )
    {
        Vec_PtrFree( vFuncsGlob );
        Cudd_Quit( dd );
        return NULL;
    }
    Dsd_Decompose( pManDsd, (DdNode **)vFuncsGlob->pArray, Abc_NtkCoNum(pNtk) );
    Vec_PtrFree( vFuncsGlob );
    Abc_NtkFreeGlobalBdds( pNtk, 0 );

    // start the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_BDD );
    // make sure the new manager has enough inputs
    Cudd_bddIthVar( (DdManager *)pNtkNew->pManFunc, dd->size-1 );
    // put the results into the new network (save new CO drivers in old CO drivers)
    Abc_NtkDsdConstruct( pManDsd, pNtk, pNtkNew );
    // finalize the new network
    Abc_NtkFinalize( pNtk, pNtkNew );
    // fix the problem with complemented and duplicated CO edges
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    if ( fPrint )
    {
        ppNamesCi = Abc_NtkCollectCioNames( pNtk, 0 );
        ppNamesCo = Abc_NtkCollectCioNames( pNtk, 1 );
        if ( fVerbose )
            Dsd_TreePrint( stdout, pManDsd, ppNamesCi, ppNamesCo, fShort, -1 );
        else
            Dsd_TreePrint2( stdout, pManDsd, ppNamesCi, ppNamesCo, -1 );
        ABC_FREE( ppNamesCi );
        ABC_FREE( ppNamesCo );
    }

    // stop the DSD manager
    Dsd_ManagerStop( pManDsd );
    return pNtkNew;
}